

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodetxb.c
# Opt level: O2

void av1_write_intra_coeffs_mb(AV1_COMMON *cm,MACROBLOCK *x,aom_writer *w,BLOCK_SIZE bsize)

{
  uint8_t uVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  int block_00;
  MB_MODE_INFO *pMVar6;
  byte tx_size;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  undefined7 in_register_00000009;
  int iVar11;
  ulong uVar12;
  int blk_row;
  int iVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  int plane;
  long lVar17;
  int iVar18;
  int blk_col;
  int iVar19;
  int block [3];
  
  uVar1 = cm->seq_params->monochrome;
  block[2] = 0;
  block[0] = 0;
  block[1] = 0;
  uVar12 = CONCAT71(in_register_00000009,bsize) & 0xffffffff;
  uVar14 = (uint)block_size_wide[uVar12];
  iVar11 = (x->e_mbd).mb_to_right_edge;
  if (iVar11 < 0) {
    uVar14 = (uint)block_size_wide[uVar12] +
             (iVar11 >> ((char)(x->e_mbd).plane[0].subsampling_x + 3U & 0x1f));
  }
  iVar15 = (int)uVar14 >> 2;
  uVar14 = (uint)block_size_high[uVar12];
  iVar11 = (x->e_mbd).mb_to_bottom_edge;
  if (iVar11 < 0) {
    uVar14 = (uint)block_size_high[uVar12] +
             (iVar11 >> ((char)(x->e_mbd).plane[0].subsampling_y + 3U & 0x1f));
  }
  iVar13 = (int)uVar14 >> 2;
  iVar11 = 0x10;
  if (iVar15 < 0x10) {
    iVar11 = iVar15;
  }
  iVar7 = 0x10;
  if (iVar13 < 0x10) {
    iVar7 = iVar13;
  }
  iVar8 = 0;
  while (iVar19 = iVar8, iVar19 < iVar13) {
    iVar8 = iVar7 + iVar19;
    iVar10 = iVar13;
    if (iVar8 < iVar13) {
      iVar10 = iVar8;
    }
    iVar9 = 0;
    while (iVar18 = iVar9, iVar18 < iVar15) {
      iVar9 = iVar11 + iVar18;
      iVar16 = iVar15;
      if (iVar9 < iVar15) {
        iVar16 = iVar9;
      }
      lVar17 = 0;
      while ((lVar17 != (ulong)(uVar1 == '\0') * 2 + 1 &&
             ((lVar17 == 0 || ((x->e_mbd).is_chroma_ref == true))))) {
        pMVar6 = *(x->e_mbd).mi;
        if ((x->e_mbd).lossless[*(ushort *)&pMVar6->field_0xa7 & 7] == 0) {
          if (lVar17 == 0) {
            tx_size = pMVar6->tx_size;
          }
          else {
            tx_size = av1_get_adjusted_tx_size
                                (""[av1_ss_size_lookup[pMVar6->bsize]
                                    [(x->e_mbd).plane[lVar17].subsampling_x]
                                    [(x->e_mbd).plane[lVar17].subsampling_y]]);
          }
        }
        else {
          tx_size = 0;
        }
        iVar4 = *(int *)((long)tx_size_high_unit + (ulong)((uint)tx_size * 4));
        iVar5 = *(int *)((long)tx_size_wide_unit + (ulong)((uint)tx_size * 4));
        bVar2 = (byte)(x->e_mbd).plane[lVar17].subsampling_y;
        bVar3 = (byte)(x->e_mbd).plane[lVar17].subsampling_x;
        for (blk_row = iVar19 >> (bVar2 & 0x1f);
            blk_row < ((1 << (bVar2 & 0x1f)) >> 1) + iVar10 >> (bVar2 & 0x1f);
            blk_row = blk_row + iVar4) {
          for (blk_col = iVar18 >> ((byte)(x->e_mbd).plane[lVar17].subsampling_x & 0x1f);
              blk_col < ((1 << (bVar3 & 0x1f)) >> 1) + iVar16 >> (bVar3 & 0x1f);
              blk_col = blk_col + iVar5) {
            block_00 = block[lVar17];
            av1_write_coeffs_txb(cm,x,w,blk_row,blk_col,(int)lVar17,block_00,tx_size);
            block[lVar17] = block_00 + iVar5 * iVar4;
          }
        }
        lVar17 = lVar17 + 1;
      }
    }
  }
  return;
}

Assistant:

void av1_write_intra_coeffs_mb(const AV1_COMMON *const cm, MACROBLOCK *x,
                               aom_writer *w, BLOCK_SIZE bsize) {
  MACROBLOCKD *xd = &x->e_mbd;
  const int num_planes = av1_num_planes(cm);
  int block[MAX_MB_PLANE] = { 0 };
  int row, col;
  assert(bsize == get_plane_block_size(bsize, xd->plane[0].subsampling_x,
                                       xd->plane[0].subsampling_y));
  const int max_blocks_wide = max_block_wide(xd, bsize, 0);
  const int max_blocks_high = max_block_high(xd, bsize, 0);
  const BLOCK_SIZE max_unit_bsize = BLOCK_64X64;
  int mu_blocks_wide = mi_size_wide[max_unit_bsize];
  int mu_blocks_high = mi_size_high[max_unit_bsize];
  mu_blocks_wide = AOMMIN(max_blocks_wide, mu_blocks_wide);
  mu_blocks_high = AOMMIN(max_blocks_high, mu_blocks_high);

  for (row = 0; row < max_blocks_high; row += mu_blocks_high) {
    for (col = 0; col < max_blocks_wide; col += mu_blocks_wide) {
      for (int plane = 0; plane < num_planes; ++plane) {
        if (plane && !xd->is_chroma_ref) break;
        const TX_SIZE tx_size = av1_get_tx_size(plane, xd);
        const int stepr = tx_size_high_unit[tx_size];
        const int stepc = tx_size_wide_unit[tx_size];
        const int step = stepr * stepc;
        const struct macroblockd_plane *const pd = &xd->plane[plane];
        const int unit_height = ROUND_POWER_OF_TWO(
            AOMMIN(mu_blocks_high + row, max_blocks_high), pd->subsampling_y);
        const int unit_width = ROUND_POWER_OF_TWO(
            AOMMIN(mu_blocks_wide + col, max_blocks_wide), pd->subsampling_x);
        for (int blk_row = row >> pd->subsampling_y; blk_row < unit_height;
             blk_row += stepr) {
          for (int blk_col = col >> pd->subsampling_x; blk_col < unit_width;
               blk_col += stepc) {
            av1_write_coeffs_txb(cm, x, w, blk_row, blk_col, plane,
                                 block[plane], tx_size);
            block[plane] += step;
          }
        }
      }
    }
  }
}